

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# celu.c
# Opt level: O2

rt_function_error_t exec_celu_generic(rt_function_t *f)

{
  long *plVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  plVar1 = (long *)f->local_context;
  puVar2 = (undefined8 *)*plVar1;
  iVar12 = 1;
  for (lVar6 = (long)*(int *)((long)plVar1 + 0xc); lVar6 < *(int *)(puVar2 + 6); lVar6 = lVar6 + 1)
  {
    iVar12 = iVar12 * *(int *)(puVar2[7] + lVar6 * 4);
  }
  iVar7 = 0;
  iVar8 = 0;
  if (0 < iVar12) {
    iVar8 = iVar12;
  }
  iVar4 = *(int *)(puVar2 + 2) / iVar12;
  if (*(int *)(puVar2 + 2) / iVar12 < 1) {
    iVar4 = iVar7;
  }
  iVar11 = 0;
  for (iVar5 = 0; iVar10 = iVar11, iVar9 = iVar8, iVar3 = iVar7, iVar5 != iVar4; iVar5 = iVar5 + 1)
  {
    while (iVar9 != 0) {
      fVar13 = (float)(*(code *)puVar2[1])(*puVar2,iVar10);
      fVar15 = fVar13;
      if (fVar13 <= 0.0) {
        fVar15 = *(float *)(plVar1 + 1);
        fVar14 = expf(fVar13);
        fVar15 = (fVar14 + -1.0) * fVar15;
      }
      (*(code *)puVar2[4])(fVar15,puVar2[3],iVar3);
      if (0.0 <= fVar13) {
        fVar15 = *(float *)(plVar1 + 1);
        fVar13 = expf(-fVar13);
        fVar13 = (fVar13 + -1.0) * fVar15;
      }
      else {
        fVar13 = -fVar13;
      }
      (*(code *)puVar2[4])(fVar13,puVar2[3],iVar3 + iVar12);
      iVar10 = iVar10 + 1;
      iVar9 = iVar9 + -1;
      iVar3 = iVar3 + 1;
    }
    iVar11 = iVar11 + iVar12;
    iVar7 = iVar7 + iVar12 * 2;
  }
  return RT_FUNCTION_ERROR_NOERROR;
}

Assistant:

rt_function_error_t exec_celu_generic(rt_function_t *f) {
  celu_local_context_t *c = (celu_local_context_t *)(f->local_context);
  celu_private_t *p = (celu_private_t *)(c->data);
  int i, j, s0 = 1, s1;

  for (i = c->axis; i < p->in_shape.size; ++i) {
    s0 *= p->in_shape.data[i];
  }
  s1 = p->input_size / s0;

  for (i = 0; i < s1; ++i) {
    for (j = 0; j < s0; ++j) {
      float x = p->get_input(p->input, i * s0 + j);
      float value = x > 0.0f ? x : c->alpha * (expf(x) - 1.0f);
      p->set_output(p->output, i * s0 * 2 + j, value);
      value = x < 0.0f ? -x : c->alpha * (expf(-x) - 1.0f);
      p->set_output(p->output, i * s0 * 2 + s0 + j, value);
    }
  }
  return RT_FUNCTION_ERROR_NOERROR;
}